

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

VertexData * __thiscall
Assimp::Ogre::Animation::AssociatedVertexData(Animation *this,VertexAnimationTrack *track)

{
  Mesh *pMVar1;
  pointer ppSVar2;
  SubMesh *pSVar3;
  VertexData **ppVVar4;
  long lVar5;
  long lVar6;
  
  pMVar1 = this->parentMesh;
  if (pMVar1 == (Mesh *)0x0) {
    return (VertexData *)0x0;
  }
  if (track->target == 0) {
    ppVVar4 = &pMVar1->sharedVertexData;
  }
  else {
    ppSVar2 = (pMVar1->subMeshes).
              super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(pMVar1->subMeshes).
                  super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2;
    if (lVar5 != 0) {
      lVar5 = lVar5 >> 3;
      lVar6 = 0;
      do {
        pSVar3 = ppSVar2[lVar6];
        if ((pSVar3->super_ISubMesh).index == track->target - 1) goto LAB_004558ed;
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    pSVar3 = (SubMesh *)0x0;
LAB_004558ed:
    ppVVar4 = &pSVar3->vertexData;
  }
  return *ppVVar4;
}

Assistant:

VertexData *Animation::AssociatedVertexData(VertexAnimationTrack *track) const
{
    if (!parentMesh)
        return 0;

    bool sharedGeom = (track->target == 0);
    if (sharedGeom)
        return parentMesh->sharedVertexData;
    else
        return parentMesh->GetSubMesh(track->target-1)->vertexData;
}